

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_normalize_var(secp256k1_fe *r)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uchar *seckey;
  ulong uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  uint64_t uVar16;
  secp256k1_ecmult_gen_context *ecmult_gen_ctx;
  uint uVar17;
  undefined1 auVar18 [16];
  uint uStack_f4;
  secp256k1_ge_storage sStack_f0;
  secp256k1_ge sStack_b0;
  secp256k1_fe *psStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  
  secp256k1_fe_verify(r);
  uVar8 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
  uVar10 = (uVar8 >> 0x34) + r->n[1];
  uVar8 = uVar8 & 0xfffffffffffff;
  uVar12 = (uVar10 >> 0x34) + r->n[2];
  uVar13 = (uVar12 >> 0x34) + r->n[3];
  uVar12 = uVar12 & 0xfffffffffffff;
  uVar16 = (uVar13 >> 0x34) + (r->n[4] & 0xffffffffffff);
  uVar11 = uVar10 & 0xfffffffffffff;
  uVar14 = uVar13 & 0xfffffffffffff;
  if (0xffffefffffc2e < uVar8 &&
      ((uVar12 & uVar10 & uVar13) == 0xfffffffffffff && uVar16 == 0xffffffffffff) ||
      uVar16 >> 0x30 != 0) {
    uVar11 = uVar11 + (uVar8 + 0x1000003d1 >> 0x34);
    uVar12 = uVar12 + (uVar11 >> 0x34);
    pauVar15 = (undefined1 (*) [16])(uVar14 + (uVar12 >> 0x34));
    uVar10 = ((ulong)pauVar15 >> 0x34) + uVar16;
    ecmult_gen_ctx = (secp256k1_ecmult_gen_context *)(uVar10 & 0x3000000000000);
    if (ecmult_gen_ctx != (secp256k1_ecmult_gen_context *)0x1000000000000) {
      secp256k1_fe_normalize_var_cold_1();
      uStack_38 = 0xfffffffffffff;
      uStack_40 = 0xffffffffffff;
      psStack_48 = r;
      if (ecmult_gen_ctx == (secp256k1_ecmult_gen_context *)0x0) {
        secp256k1_keypair_create_cold_4();
      }
      else if (pauVar15 != (undefined1 (*) [16])0x0) {
        pauVar15[5] = (undefined1  [16])0x0;
        pauVar15[4] = (undefined1  [16])0x0;
        pauVar15[3] = (undefined1  [16])0x0;
        pauVar15[2] = (undefined1  [16])0x0;
        pauVar15[1] = (undefined1  [16])0x0;
        *pauVar15 = (undefined1  [16])0x0;
        if (ecmult_gen_ctx->built == 0) {
          secp256k1_keypair_create_cold_2();
          return;
        }
        if (seckey == (uchar *)0x0) {
          secp256k1_keypair_create_cold_1();
          return;
        }
        iVar7 = secp256k1_ec_pubkey_create_helper(ecmult_gen_ctx,&uStack_f4,&sStack_b0,seckey);
        *pauVar15 = (undefined1  [16])0x0;
        pauVar15[1] = (undefined1  [16])0x0;
        *(uint *)(pauVar15[1] + 0xc) =
             uStack_f4 >> 0x18 | (uStack_f4 & 0xff0000) >> 8 | (uStack_f4 & 0xff00) << 8 |
             uStack_f4 << 0x18;
        secp256k1_ge_to_storage(&sStack_f0,&sStack_b0);
        *(uint64_t *)pauVar15[5] = sStack_f0.y.n[2];
        *(uint64_t *)(pauVar15[5] + 8) = sStack_f0.y.n[3];
        *(uint64_t *)pauVar15[4] = sStack_f0.y.n[0];
        *(uint64_t *)(pauVar15[4] + 8) = sStack_f0.y.n[1];
        *(uint64_t *)pauVar15[3] = sStack_f0.x.n[2];
        *(uint64_t *)(pauVar15[3] + 8) = sStack_f0.x.n[3];
        *(ulong *)pauVar15[2] = CONCAT44(sStack_f0.x.n[0]._4_4_,(undefined4)sStack_f0.x.n[0]);
        *(uint64_t *)(pauVar15[2] + 8) = sStack_f0.x.n[1];
        cVar6 = ((byte)iVar7 ^ 1) - 1;
        auVar18 = ZEXT216(CONCAT11(cVar6,cVar6));
        auVar18 = pshuflw(auVar18,auVar18,0);
        uVar17 = auVar18._0_4_;
        lVar9 = 0;
        do {
          puVar1 = (uint *)(*pauVar15 + lVar9);
          uVar3 = puVar1[1];
          uVar4 = puVar1[2];
          uVar5 = puVar1[3];
          puVar2 = (uint *)(*pauVar15 + lVar9);
          *puVar2 = *puVar1 & uVar17;
          puVar2[1] = uVar3 & uVar17;
          puVar2[2] = uVar4 & uVar17;
          puVar2[3] = uVar5 & uVar17;
          lVar9 = lVar9 + 0x10;
        } while (lVar9 != 0x60);
        return;
      }
      secp256k1_keypair_create_cold_3();
      return;
    }
    uVar14 = (ulong)pauVar15 & 0xfffffffffffff;
    uVar12 = uVar12 & 0xfffffffffffff;
    uVar11 = uVar11 & 0xfffffffffffff;
    uVar8 = uVar8 + 0x1000003d1 & 0xfffffffffffff;
    uVar16 = uVar10 & 0xffffffffffff;
  }
  r->n[0] = uVar8;
  r->n[1] = uVar11;
  r->n[2] = uVar12;
  r->n[3] = uVar14;
  r->n[4] = uVar16;
  r->magnitude = 1;
  r->normalized = 1;
  secp256k1_fe_verify(r);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_normalize_var(secp256k1_fe *r) {
    secp256k1_fe_verify(r);
    secp256k1_fe_impl_normalize_var(r);
    r->magnitude = 1;
    r->normalized = 1;
    secp256k1_fe_verify(r);
}